

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

GCproto * lj_bcread_proto(LexState *ls)

{
  byte bVar1;
  byte *pbVar2;
  uint sizekgc_00;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint sizedbg_00;
  int iVar9;
  int iVar10;
  int iVar11;
  LexState *ls_00;
  void *pvVar12;
  long in_RDI;
  MSize sizeli;
  BCLine numline;
  BCLine firstline;
  MSize sizedbg;
  MSize ofsdbg;
  MSize ofsuv;
  MSize ofsk;
  MSize sizept;
  MSize sizebc;
  MSize sizekn;
  MSize sizekgc;
  MSize sizeuv;
  MSize flags;
  MSize numparams;
  MSize framesize;
  GCproto *pt;
  uint32_t v_5;
  uint32_t v_4;
  uint32_t v_3;
  uint32_t v_2;
  uint32_t v_1;
  uint32_t v;
  sbyte local_d4;
  int in_stack_ffffffffffffff30;
  MSize in_stack_ffffffffffffff34;
  uint32_t uVar13;
  uint32_t size;
  uint32_t uVar14;
  
  uVar14 = 0;
  size = 0;
  uVar13 = 0;
  pbVar2 = *(byte **)(in_RDI + 0x20);
  *(byte **)(in_RDI + 0x20) = pbVar2 + 1;
  sizekgc_00 = (uint)*pbVar2;
  pbVar2 = *(byte **)(in_RDI + 0x20);
  *(byte **)(in_RDI + 0x20) = pbVar2 + 1;
  uVar3 = (uint)*pbVar2;
  pbVar2 = *(byte **)(in_RDI + 0x20);
  *(byte **)(in_RDI + 0x20) = pbVar2 + 1;
  uVar4 = (uint)*pbVar2;
  pbVar2 = *(byte **)(in_RDI + 0x20);
  *(byte **)(in_RDI + 0x20) = pbVar2 + 1;
  bVar1 = *pbVar2;
  uVar5 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
  uVar6 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
  uVar7 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
  iVar8 = uVar7 + 1;
  if (((*(uint *)(in_RDI + 0x9c) & 2) == 0) &&
     (uVar14 = lj_buf_ruleb128((char **)(in_RDI + 0x20)), uVar14 != 0)) {
    size = lj_buf_ruleb128((char **)(in_RDI + 0x20));
    uVar13 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
  }
  sizedbg_00 = iVar8 * 4 + uVar5 * 4 + 0x47 & 0xfffffff8;
  iVar9 = uVar6 * 8 + sizedbg_00;
  iVar10 = (bVar1 + 1 & 0xfffffffe) * 2 + iVar9;
  iVar11 = uVar14 + iVar10;
  ls_00 = (LexState *)lj_mem_newgco((lua_State *)CONCAT44(iVar10,uVar14),size);
  *(undefined1 *)((long)&ls_00->fs + 5) = 7;
  *(char *)((long)&ls_00->fs + 6) = (char)uVar3;
  *(char *)((long)&ls_00->fs + 7) = (char)uVar4;
  *(int *)&ls_00->L = iVar8;
  (ls_00->tokval).u32.lo = (int)ls_00 + sizedbg_00;
  (ls_00->tokval).field_2.it = (int)ls_00 + iVar9;
  (ls_00->lookaheadval).u32.lo = 0;
  (ls_00->lookaheadval).field_2.it = uVar6;
  *(int *)&ls_00->p = iVar11;
  *(byte *)((long)&ls_00->p + 4) = bVar1;
  *(char *)((long)&ls_00->p + 5) = (char)sizekgc_00;
  *(undefined2 *)((long)&ls_00->p + 6) = 0;
  *(int *)&ls_00->pe = (int)*(undefined8 *)(in_RDI + 0x68);
  *(undefined4 *)((long)ls_00 + (ulong)(uVar5 + 1) * -4 + (ulong)sizedbg_00) = 0;
  bcread_bytecode((LexState *)CONCAT44(sizedbg_00,iVar9),(GCproto *)CONCAT44(iVar10,uVar14),size);
  bcread_uv((LexState *)CONCAT44(iVar10,uVar14),(GCproto *)CONCAT44(size,uVar13),
            in_stack_ffffffffffffff34);
  bcread_kgc(ls_00,(GCproto *)CONCAT44(uVar4,uVar3),sizekgc_00);
  (ls_00->lookaheadval).u32.lo = uVar5;
  bcread_knum((LexState *)CONCAT44(iVar10,uVar14),(GCproto *)CONCAT44(size,uVar13),
              in_stack_ffffffffffffff34);
  ((GCRef *)&ls_00->pe)[1] = (GCRef)size;
  ls_00->c = uVar13;
  if (uVar14 == 0) {
    ((MRef *)&ls_00->tok)->ptr32 = 0;
    ((MRef *)&ls_00->lookahead)->ptr32 = 0;
    (ls_00->sb).p.ptr32 = 0;
  }
  else {
    in_stack_ffffffffffffff30 = iVar8 + -1;
    if ((int)uVar13 < 0x100) {
      local_d4 = 0;
    }
    else {
      local_d4 = 2;
      if ((int)uVar13 < 0x10000) {
        local_d4 = 1;
      }
    }
    in_stack_ffffffffffffff34 = in_stack_ffffffffffffff30 << local_d4;
    ((MRef *)&ls_00->tok)->ptr32 = (int)ls_00 + iVar10;
    ((MRef *)&ls_00->lookahead)->ptr32 = (int)ls_00 + iVar10 + in_stack_ffffffffffffff34;
    bcread_dbg((LexState *)CONCAT44(uVar5,uVar6),(GCproto *)CONCAT44(iVar8,iVar11),sizedbg_00);
    pvVar12 = bcread_varinfo((GCproto *)ls_00);
    (ls_00->sb).p.ptr32 = (uint32_t)pvVar12;
  }
  lj_memprof_add_proto((GCproto *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  lj_sysprof_add_proto((GCproto *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  return (GCproto *)ls_00;
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif

#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  return pt;
}